

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Path::make(Path *this,Value *root)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator key;
  Value *in_RSI;
  vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *in_RDI;
  PathArgument *arg;
  const_iterator it;
  Value *node;
  ArrayIndex in_stack_00000244;
  Value *in_stack_00000248;
  reference in_stack_ffffffffffffffd0;
  Value *local_18;
  
  this_00 = std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin(in_RDI);
  local_18 = in_RSI;
  while( true ) {
    key = std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end(in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
         ::operator*((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                      *)&stack0xffffffffffffffe0);
    if (in_stack_ffffffffffffffd0->kind_ == kindIndex) {
      Value::isArray(local_18);
      local_18 = Value::operator[](in_stack_00000248,in_stack_00000244);
    }
    else if (in_stack_ffffffffffffffd0->kind_ == kindKey) {
      Value::isObject(local_18);
      local_18 = Value::operator[]((Value *)this_00._M_current,&(key._M_current)->key_);
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  return local_18;
}

Assistant:

Value& Path::make(Value& root) const {
  Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray()) {
        // Error: node is not an array at position ...
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: node is not an object at position...
      }
      node = &((*node)[arg.key_]);
    }
  }
  return *node;
}